

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int ptrmapGet(BtShared *pBt,Pgno key,u8 *pEType,Pgno *pPgno)

{
  long lVar1;
  Pgno PVar2;
  int iVar3;
  u32 uVar4;
  void *pvVar5;
  u32 *in_RCX;
  byte *in_RDX;
  Pgno in_ESI;
  BtShared *in_RDI;
  long in_FS_OFFSET;
  int rc;
  int offset;
  u8 *pPtrmap;
  int iPtrmap;
  DbPage *pDbPage;
  int in_stack_ffffffffffffffac;
  undefined4 uVar6;
  undefined4 uVar7;
  Pgno pgno;
  undefined4 in_stack_ffffffffffffffc0;
  int local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pgno = 0xaaaaaaaa;
  uVar7 = 0xaaaaaaaa;
  uVar6 = 0xaaaaaaaa;
  PVar2 = ptrmapPageno(in_RDI,in_ESI);
  local_14 = sqlite3PagerGet((Pager *)CONCAT44(PVar2,in_stack_ffffffffffffffc0),pgno,
                             (DbPage **)CONCAT44(uVar7,uVar6),in_stack_ffffffffffffffac);
  if (local_14 == 0) {
    pvVar5 = sqlite3PagerGetData((DbPage *)&DAT_aaaaaaaaaaaaaaaa);
    iVar3 = ((in_ESI - PVar2) + -1) * 5;
    if (iVar3 < 0) {
      sqlite3PagerUnref((DbPage *)0x16d63f);
      local_14 = sqlite3CorruptError(0);
    }
    else {
      *in_RDX = *(byte *)((long)pvVar5 + (long)iVar3);
      if (in_RCX != (u32 *)0x0) {
        uVar4 = sqlite3Get4byte((u8 *)((long)pvVar5 + (long)(iVar3 + 1)));
        *in_RCX = uVar4;
      }
      sqlite3PagerUnref((DbPage *)0x16d694);
      if ((*in_RDX == 0) || (5 < *in_RDX)) {
        local_14 = sqlite3CorruptError(0);
      }
      else {
        local_14 = 0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_14;
}

Assistant:

static int ptrmapGet(BtShared *pBt, Pgno key, u8 *pEType, Pgno *pPgno){
  DbPage *pDbPage;   /* The pointer map page */
  int iPtrmap;       /* Pointer map page index */
  u8 *pPtrmap;       /* Pointer map page data */
  int offset;        /* Offset of entry in pointer map */
  int rc;

  assert( sqlite3_mutex_held(pBt->mutex) );

  iPtrmap = PTRMAP_PAGENO(pBt, key);
  rc = sqlite3PagerGet(pBt->pPager, iPtrmap, &pDbPage, 0);
  if( rc!=0 ){
    return rc;
  }
  pPtrmap = (u8 *)sqlite3PagerGetData(pDbPage);

  offset = PTRMAP_PTROFFSET(iPtrmap, key);
  if( offset<0 ){
    sqlite3PagerUnref(pDbPage);
    return SQLITE_CORRUPT_BKPT;
  }
  assert( offset <= (int)pBt->usableSize-5 );
  assert( pEType!=0 );
  *pEType = pPtrmap[offset];
  if( pPgno ) *pPgno = get4byte(&pPtrmap[offset+1]);

  sqlite3PagerUnref(pDbPage);
  if( *pEType<1 || *pEType>5 ) return SQLITE_CORRUPT_PGNO(iPtrmap);
  return SQLITE_OK;
}